

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

void __thiscall Node::Node(Node *this,NodeType t,shared_ptr<Node> *l,shared_ptr<Node> *r)

{
  shared_ptr<Node> *r_local;
  shared_ptr<Node> *l_local;
  NodeType t_local;
  Node *this_local;
  
  this->type = t;
  std::__cxx11::string::string((string *)&this->value);
  std::shared_ptr<Node>::shared_ptr(&this->left,l);
  std::shared_ptr<Node>::shared_ptr(&this->right,r);
  return;
}

Assistant:

Node( NodeType t, std::shared_ptr<Node> l, std::shared_ptr<Node> r ) : type( t ), left( l ), right( r ) {}